

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPDependClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPDependClause *this)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppvVar4;
  reference ppcVar5;
  ulong uVar6;
  string local_f8;
  string local_d8;
  string local_b8 [39];
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  uint local_6c;
  OpenMPDependClauseType local_68;
  uint i;
  OpenMPDependClauseType type;
  string clause_string;
  allocator<char> local_2a;
  byte local_29;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
  *local_28;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
  *depend_iterators_definition_class;
  OpenMPDependClause *pOStack_18;
  OpenMPDependClauseModifier modifier;
  OpenMPDependClause *this_local;
  string *result;
  
  pOStack_18 = this;
  this_local = (OpenMPDependClause *)__return_storage_ptr__;
  depend_iterators_definition_class._4_4_ = getModifier(this);
  if (depend_iterators_definition_class._4_4_ == OMPC_DEPEND_MODIFIER_iterator) {
    local_28 = getDependIteratorsDefinitionClass(this);
  }
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"depend ",&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,"(",(allocator<char> *)((long)&i + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  local_68 = getType(this);
  if (depend_iterators_definition_class._4_4_ == OMPC_DEPEND_MODIFIER_iterator) {
    std::__cxx11::string::operator+=((string *)&type,"iterator");
    std::__cxx11::string::operator+=((string *)&type," ( ");
    for (local_6c = 0; uVar6 = (ulong)local_6c,
        sVar3 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::size(local_28), uVar6 < sVar3; local_6c = local_6c + 1) {
      ppvVar4 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(local_28,(ulong)local_6c);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,0);
      std::__cxx11::string::operator+=((string *)&type,*ppcVar5);
      ppvVar4 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(local_28,(ulong)local_6c);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,0);
      iVar2 = strcmp(*ppcVar5,"");
      if (iVar2 != 0) {
        std::__cxx11::string::operator+=((string *)&type," ");
      }
      ppvVar4 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(local_28,(ulong)local_6c);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,1);
      std::__cxx11::string::operator+=((string *)&type,*ppcVar5);
      std::__cxx11::string::operator+=((string *)&type,"=");
      ppvVar4 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(local_28,(ulong)local_6c);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,2);
      std::__cxx11::string::operator+=((string *)&type,*ppcVar5);
      std::__cxx11::string::operator+=((string *)&type,":");
      ppvVar4 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(local_28,(ulong)local_6c);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,3);
      std::__cxx11::string::operator+=((string *)&type,*ppcVar5);
      ppvVar4 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(local_28,(ulong)local_6c);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,4);
      __s = *ppcVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_91);
      bVar1 = std::operator!=(&local_90,"");
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)&type,":");
        ppvVar4 = std::
                  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                  ::at(local_28,(ulong)local_6c);
        ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,4);
        std::__cxx11::string::operator+=((string *)&type,*ppcVar5);
      }
      std::__cxx11::string::operator+=((string *)&type,", ");
    }
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_b8,(ulong)&type);
    std::__cxx11::string::operator=((string *)&type,local_b8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::operator+=((string *)&type," )");
  }
  uVar6 = std::__cxx11::string::size();
  if (1 < uVar6) {
    std::__cxx11::string::operator+=((string *)&type,", ");
  }
  switch(local_68) {
  case OMPC_DEPENDENCE_TYPE_in:
    std::__cxx11::string::operator+=((string *)&type,"in");
    break;
  case OMPC_DEPENDENCE_TYPE_out:
    std::__cxx11::string::operator+=((string *)&type,"out");
    break;
  case OMPC_DEPENDENCE_TYPE_inout:
    std::__cxx11::string::operator+=((string *)&type,"inout");
    break;
  case OMPC_DEPENDENCE_TYPE_mutexinoutset:
    std::__cxx11::string::operator+=((string *)&type,"mutexinoutset");
    break;
  case OMPC_DEPENDENCE_TYPE_depobj:
    std::__cxx11::string::operator+=((string *)&type,"depobj");
    break;
  case OMPC_DEPENDENCE_TYPE_source:
    std::__cxx11::string::operator+=((string *)&type,"source");
    break;
  case OMPC_DEPENDENCE_TYPE_sink:
    std::__cxx11::string::operator+=((string *)&type,"sink");
  }
  uVar6 = std::__cxx11::string::size();
  if ((1 < uVar6) && (local_68 != OMPC_DEPENDENCE_TYPE_source)) {
    std::__cxx11::string::operator+=((string *)&type," : ");
  }
  if (local_68 == OMPC_DEPENDENCE_TYPE_sink) {
    getDependenceVector_abi_cxx11_(&local_d8,this);
    std::__cxx11::string::operator+=((string *)&type,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_f8,&this->super_OpenMPClause);
  std::__cxx11::string::operator+=((string *)&type,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::operator+=((string *)&type,") ");
  uVar6 = std::__cxx11::string::size();
  if (3 < uVar6) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&type);
  }
  local_29 = 1;
  std::__cxx11::string::~string((string *)&type);
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDependClause::toString() {
    OpenMPDependClauseModifier modifier = this->getModifier();
    std::vector<vector<const char*>* >* depend_iterators_definition_class;
    if (modifier == OMPC_DEPEND_MODIFIER_iterator) {
        depend_iterators_definition_class = this->getDependIteratorsDefinitionClass();
    }
    std::string result = "depend ";
    std::string clause_string = "(";

    OpenMPDependClauseType type = this->getType();
    if (modifier == OMPC_DEPEND_MODIFIER_iterator) {
        switch (modifier) {
            case OMPC_DEPEND_MODIFIER_iterator: {
                clause_string += "iterator";
                clause_string += " ( ";
                for (unsigned int i = 0; i < depend_iterators_definition_class->size(); i++) {
                    clause_string += depend_iterators_definition_class->at(i)->at(0);
                    if (strcmp(depend_iterators_definition_class->at(i)->at(0), "\0") != 0) {
                        clause_string += " ";
                    };
                    clause_string += depend_iterators_definition_class->at(i)->at(1);
                    clause_string += "=";
                    clause_string += depend_iterators_definition_class->at(i)->at(2);
                    clause_string += ":";
                    clause_string += depend_iterators_definition_class->at(i)->at(3);
                    if ((string)depend_iterators_definition_class->at(i)->at(4) != "") {
                        clause_string += ":";
                        clause_string += depend_iterators_definition_class->at(i)->at(4);
                    };
                    clause_string += ", ";
                };
                clause_string = clause_string.substr(0, clause_string.size()-2);

                clause_string += " )";
            }
            default:
            ;
        }
    }

    if (clause_string.size() > 1) {
        clause_string += ", ";
    };
    switch (type) {
        case OMPC_DEPENDENCE_TYPE_in:
            clause_string += "in";
            break;
        case OMPC_DEPENDENCE_TYPE_out:
            clause_string += "out";
            break;
        case OMPC_DEPENDENCE_TYPE_inout:
            clause_string += "inout";
            break;
        case OMPC_DEPENDENCE_TYPE_mutexinoutset:
            clause_string += "mutexinoutset";
            break;
        case OMPC_DEPENDENCE_TYPE_depobj:
            clause_string += "depobj";
            break;
        case OMPC_DEPENDENCE_TYPE_source:
            clause_string += "source";
            break;
        case OMPC_DEPENDENCE_TYPE_sink:
            clause_string += "sink";
            break;
        default:
            ;
    }

    if (clause_string.size() > 1&&type!=OMPC_DEPENDENCE_TYPE_source) {
        clause_string += " : ";

    };
    if(type==OMPC_DEPENDENCE_TYPE_sink){clause_string += this->getDependenceVector();}
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };
    return result;
}